

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall
ON_Leader::GetTextXform
          (ON_Leader *this,ON_Xform *model_xform,ON_Viewport *vp,ON_DimStyle *dimstyle,
          double dimscale,ON_Xform *text_xform_out)

{
  ON_3dVector axis;
  ON_3dPoint point_on_mirror_plane;
  ON_3dPoint point_on_mirror_plane_00;
  ON_3dPoint center;
  ON_3dVector normal_to_mirror_plane;
  ON_3dVector normal_to_mirror_plane_00;
  ON_2dPoint OVar1;
  MaskFrame MVar2;
  ContentAngleStyle CVar3;
  bool bVar4;
  TextOrientation TVar5;
  int iVar6;
  view_projection vVar7;
  ON_TextContent *this_00;
  ON_Plane *pOVar8;
  wchar_t *pwVar9;
  ON_2dPoint *pOVar10;
  ON_TextMask *this_01;
  double dVar11;
  double dVar12;
  double dVar13;
  ON_2dPoint OVar14;
  ON_2dVector OVar15;
  double local_fa8;
  ON_Xform local_da8;
  ON_Xform local_d28;
  ON_Xform local_ca8;
  ON_Xform local_c28;
  ON_Xform local_ba8;
  double local_b28;
  double dStack_b20;
  double local_b18;
  double local_b08;
  double dStack_b00;
  double local_af8;
  ON_Xform local_ae8;
  double local_a68;
  double dStack_a60;
  double local_a58;
  double local_a48;
  double dStack_a40;
  double local_a38;
  undefined1 local_a28 [8];
  ON_Xform mxf;
  double fliptol;
  undefined1 local_998 [6];
  bool flip_y;
  bool flip_x;
  ON_Xform xfr;
  ON_3dVector text_zdir;
  undefined1 auStack_8f8 [8];
  ON_3dVector text_ydir;
  undefined1 auStack_8d8 [8];
  ON_3dVector text_xdir;
  ON_Xform local_8b8;
  ON_Xform local_838;
  ON_Xform local_7b8;
  ON_Xform local_738;
  undefined1 local_6b8 [8];
  ON_3dPoint text_point_3d;
  ON_Plane *ldrplane;
  ON_2dVector local_658;
  ON_Xform local_648;
  undefined1 auStack_5c8 [8];
  ON_Xform leader_to_text_pt_xf;
  ON_Xform world_to_leader_xf;
  ON_Xform textrotation_xf;
  ON_Xform textcenter_xf;
  undefined1 local_3c0 [8];
  ON_Xform textscale_xf;
  undefined1 local_330 [8];
  ON_2dVector text_dir;
  ON_Plane *leaderplane;
  double local_310;
  ON_2dPoint local_308;
  double local_2f8;
  double x_offset;
  double local_2e8;
  ON_2dPoint local_2e0;
  ON_2dVector local_2d0;
  ON_2dPoint local_2c0;
  ON_2dVector local_2b0;
  ON_2dPoint local_2a0;
  ON_2dVector local_290;
  ON_2dVector local_280;
  double local_270;
  double radius;
  double half_height;
  double text_gap;
  double landing_length;
  ON_2dPoint text_pt2;
  TextVerticalAlignment attach;
  ON_2dVector text_shift;
  undefined1 local_208 [8];
  ON_2dPoint text_pt;
  ON_2dPoint text_center;
  ON_2dPoint text_corners [4];
  double line_height;
  double textblock_height;
  double textblock_width;
  ON_wString rtfstr;
  ON_SHA1_Hash local_16d;
  TextHorizontalAlignment local_159;
  double dStack_158;
  TextHorizontalAlignment last_halign;
  double xdotx;
  TextVerticalAlignment valign;
  TextHorizontalAlignment local_139;
  undefined1 auStack_138 [7];
  TextHorizontalAlignment halign;
  ON_Plane objectplane;
  undefined1 local_b0 [8];
  ON_3dVector view_z;
  ON_3dVector view_y;
  ON_3dVector view_x;
  ON_2dVector tail_dir;
  ContentAngleStyle textangle_style;
  MaskFrame maskframe;
  ON_TextContent *text;
  ON_Xform *text_xform_out_local;
  double dimscale_local;
  ON_DimStyle *dimstyle_local;
  ON_Viewport *vp_local;
  ON_Xform *model_xform_local;
  ON_Leader *this_local;
  
  if (dimstyle == (ON_DimStyle *)0x0) {
    return false;
  }
  this_00 = ON_Annotation::Text(&this->super_ON_Annotation);
  if (this_00 == (ON_TextContent *)0x0) {
    return true;
  }
  MVar2 = ON_DimStyle::MaskFrameType(dimstyle);
  CVar3 = ON_DimStyle::LeaderContentAngleStyle(dimstyle);
  join_0x00001240_0x00001200_ = TailDirection(this,dimstyle);
  if (vp == (ON_Viewport *)0x0) {
    view_y.z = ON_3dVector::XAxis.x;
    view_x.x = ON_3dVector::XAxis.y;
    view_x.y = ON_3dVector::XAxis.z;
    view_z.z = ON_3dVector::YAxis.x;
    view_y.x = ON_3dVector::YAxis.y;
    view_y.y = ON_3dVector::YAxis.z;
  }
  else {
    ON_Viewport::CameraX((ON_3dVector *)&view_y.z,vp);
    ON_Viewport::CameraY((ON_3dVector *)&view_z.z,vp);
  }
  ON_CrossProduct((ON_3dVector *)local_b0,(ON_3dVector *)&view_y.z,(ON_3dVector *)&view_z.z);
  pOVar8 = ON_Annotation::Plane(&this->super_ON_Annotation);
  objectplane.plane_equation.y = (pOVar8->plane_equation).z;
  objectplane.plane_equation.z = (pOVar8->plane_equation).d;
  objectplane.zaxis.z = (pOVar8->plane_equation).x;
  objectplane.plane_equation.x = (pOVar8->plane_equation).y;
  objectplane.zaxis.x = (pOVar8->zaxis).y;
  objectplane.zaxis.y = (pOVar8->zaxis).z;
  objectplane.yaxis.y = (pOVar8->yaxis).z;
  objectplane.yaxis.z = (pOVar8->zaxis).x;
  _auStack_138 = (pOVar8->origin).x;
  objectplane.origin.x = (pOVar8->origin).y;
  objectplane.origin.y = (pOVar8->origin).z;
  objectplane.origin.z = (pOVar8->xaxis).x;
  objectplane.xaxis.x = (pOVar8->xaxis).y;
  objectplane.xaxis.y = (pOVar8->xaxis).z;
  objectplane.xaxis.z = (pOVar8->yaxis).x;
  objectplane.yaxis.x = (pOVar8->yaxis).y;
  local_139 = ON_DimStyle::LeaderTextHorizontalAlignment(dimstyle);
  xdotx._3_1_ = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
  if (local_139 == Auto) {
    dStack_158 = ON_3dVector::operator*
                           ((ON_3dVector *)&objectplane.origin.z,(ON_3dVector *)&view_y.z);
    if (view_x.z < -1e-05) {
      dStack_158 = -dStack_158;
    }
    if (dStack_158 <= -1e-05) {
      local_139 = Right;
    }
    else {
      local_139 = Left;
    }
  }
  local_159 = ON_TextContent::RuntimeHorizontalAlignment(this_00);
  ON_TextContent::SetRuntimeHorizontalAlignment(this_00,local_139);
  if (local_159 != local_139) {
    ON_TextContent::SetAlignment(this_00,local_139,xdotx._3_1_);
  }
  ON_Annotation::DimStyleTextPositionPropertiesHash(&local_16d,&this->super_ON_Annotation);
  ON_DimStyle::TextPositionPropertiesHash((ON_SHA1_Hash *)((long)&rtfstr.m_s + 7),dimstyle);
  bVar4 = ::operator!=(&local_16d,(ON_SHA1_Hash *)((long)&rtfstr.m_s + 7));
  if (bVar4) {
    pwVar9 = ON_TextContent::RtfText(this_00);
    ON_wString::ON_wString((ON_wString *)&textblock_width,pwVar9);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&textblock_width);
    bVar4 = ON_TextContent::TextIsWrapped(this_00);
    dVar11 = ON_TextContent::FormattingRectangleWidth(this_00);
    dVar12 = ON_TextContent::TextRotationRadians(this_00);
    ON_TextContent::Create(this_00,pwVar9,Leader,dimstyle,bVar4,dVar11,dVar12);
    ON_TextContent::SetAlignment(this_00,local_139,xdotx._3_1_);
    ON_wString::~ON_wString((ON_wString *)&textblock_width);
  }
  text_corners[3].y = 1.0;
  ON_2dPoint::ON_2dPoint((ON_2dPoint *)local_208,0.0,0.0);
  bVar4 = ON_TextContent::Get2dCorners(this_00,(ON_2dPoint *)&text_center.y);
  if (!bVar4) goto LAB_006a1962;
  OVar14 = ON_2dPoint::operator+((ON_2dPoint *)&text_center.y,(ON_2dPoint *)&text_corners[1].y);
  text_shift.y = OVar14.x;
  OVar14 = ON_2dPoint::operator/((ON_2dPoint *)&text_shift.y,2.0);
  text_center.x = OVar14.y;
  text_pt.y = OVar14.x;
  dVar11 = text_corners[0].y - text_center.y;
  dVar12 = text_corners[3].x - text_corners[0].x;
  text_corners[3].y = ON_DimStyle::TextHeight(dimstyle);
  text_shift.x = 0.0;
  if (MVar2 != CapsuleFrame) {
    text_pt2.y._7_1_ = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
    switch(text_pt2.y._7_1_) {
    case Top:
      text_shift.x = -dVar12 / 2.0;
      break;
    case MiddleOfTop:
      text_shift.x = -(dVar12 / 2.0) + text_corners[3].y / 2.0;
      break;
    case BottomOfTop:
      text_shift.x = -(dVar12 / 2.0) + text_corners[3].y;
      break;
    case Middle:
      text_shift.x = 0.0;
      break;
    case MiddleOfBottom:
      text_shift.x = dVar12 / 2.0 - text_corners[3].y / 2.0;
      break;
    case Bottom:
      text_shift.x = dVar12 / 2.0;
      break;
    case BottomOfBoundingBox:
      dVar13 = ON_DimStyle::TextGap(dimstyle);
      text_shift.x = dVar12 * 0.5 + dVar13;
    }
  }
  ON_2dPoint::ON_2dPoint((ON_2dPoint *)&landing_length,0.0,0.0);
  iVar6 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
  if (0 < iVar6) {
    iVar6 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
    pOVar10 = ON_SimpleArray<ON_2dPoint>::operator[]
                        (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,iVar6 + -1);
    landing_length = pOVar10->x;
    text_pt2.x = pOVar10->y;
  }
  text_gap = 0.0;
  bVar4 = ON_DimStyle::LeaderHasLanding(dimstyle);
  if (bVar4) {
    text_gap = ON_DimStyle::LeaderLandingLength(dimstyle);
  }
  half_height = ON_DimStyle::TextGap(dimstyle);
  if (MVar2 != NoFrame) {
    this_01 = ON_DimStyle::TextMask(dimstyle);
    dVar13 = ON_TextMask::MaskBorder(this_01);
    half_height = dVar13 + half_height;
  }
  if (MVar2 == CapsuleFrame) {
    radius = dimscale * (dVar12 * 0.5 + half_height);
    ON_2dVector::ON_2dVector(&local_280,radius,radius);
    local_270 = ON_2dVector::Length(&local_280);
    OVar14.y = text_pt2.x;
    OVar14.x = landing_length;
    if (0.0 < text_gap) {
      if (0.0 <= view_x.z) {
        ON_2dVector::ON_2dVector(&local_290,1.0,0.0);
      }
      else {
        ON_2dVector::ON_2dVector(&local_290,-1.0,0.0);
      }
      tail_dir.x = local_290.y;
      view_x.z = local_290.x;
      local_2b0 = ON_2dVector::operator*((ON_2dVector *)&view_x.z,text_gap);
      local_2a0 = ON_2dPoint::operator+((ON_2dPoint *)&landing_length,&local_2b0);
      OVar14 = local_2a0;
    }
    text_pt2.x = OVar14.y;
    landing_length = OVar14.x;
    if (((CVar3 != Aligned) || (text_gap != 0.0)) || (NAN(text_gap))) {
      if ((0.1 < ABS(view_x.z)) && (dVar12 < dVar11)) {
        if (view_x.z <= 0.0) {
          landing_length = landing_length - (-local_270 * 0.5 + dVar11 * 0.5 + half_height);
        }
        else {
          landing_length = -local_270 * 0.5 + dVar11 * 0.5 + half_height + landing_length;
        }
      }
      OVar1.y = text_pt2.x;
      OVar1.x = landing_length;
    }
    else {
      local_2d0 = ON_2dVector::operator*
                            ((ON_2dVector *)&view_x.z,(dVar11 * 0.5 + half_height) - local_270 * 0.5
                            );
      local_2c0 = ON_2dPoint::operator+((ON_2dPoint *)&landing_length,&local_2d0);
      OVar1 = local_2c0;
    }
    text_pt2.x = OVar1.y;
    landing_length = OVar1.x;
    OVar15 = ON_2dVector::operator*((ON_2dVector *)&view_x.z,local_270);
    local_2e8 = OVar15.y;
    x_offset = OVar15.x;
    local_2e0 = ON_2dPoint::operator+((ON_2dPoint *)&landing_length,(ON_2dVector *)&x_offset);
    OVar14 = local_2e0;
  }
  else {
    local_2f8 = dimscale * (text_gap + half_height + dVar11 * 0.5);
    OVar15 = ON_2dVector::operator*((ON_2dVector *)&view_x.z,local_2f8);
    local_310 = OVar15.y;
    leaderplane = (ON_Plane *)OVar15.x;
    local_308 = ON_2dPoint::operator+((ON_2dPoint *)&landing_length,(ON_2dVector *)&leaderplane);
    OVar14 = local_308;
  }
  text_pt2.x = OVar14.y;
  landing_length = OVar14.x;
  text_dir.y = (double)ON_Annotation::Plane(&this->super_ON_Annotation);
  ON_2dVector::ON_2dVector((ON_2dVector *)local_330,1.0,0.0);
  if (CVar3 == Aligned) {
    local_330 = (undefined1  [8])view_x.z;
    text_dir.x = tail_dir.x;
    OVar15.y = tail_dir.x;
    OVar15.x = textscale_xf.m_xform[3][3];
    if (view_x.z < 0.0) {
      OVar15 = ON_2dVector::operator-((ON_2dVector *)local_330);
      local_330 = (undefined1  [8])OVar15.x;
    }
  }
  else {
    if (CVar3 == Rotated) {
      local_330 = (undefined1  [8])view_x.z;
      text_dir.x = tail_dir.x;
    }
    OVar15.y = text_dir.x;
    OVar15.x = textscale_xf.m_xform[3][3];
  }
  text_dir.x = OVar15.y;
  textscale_xf.m_xform[3][3] = OVar15.x;
  bVar4 = ON_2dVector::Unitize((ON_2dVector *)local_330);
  if (!bVar4) {
    ON_2dVector::Set((ON_2dVector *)local_330,1.0,0.0);
  }
  ON_Xform::DiagonalTransformation((ON_Xform *)local_3c0,dimscale);
  textrotation_xf.m_xform[3][3] = ON_Xform::IdentityTransformation.m_xform[0][0];
  textrotation_xf.m_xform[3][1] = ON_Xform::IdentityTransformation.m_xform[3][2];
  textrotation_xf.m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][3];
  textrotation_xf.m_xform[2][3] = ON_Xform::IdentityTransformation.m_xform[3][0];
  textrotation_xf.m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][1];
  textrotation_xf.m_xform[2][1] = ON_Xform::IdentityTransformation.m_xform[2][2];
  textrotation_xf.m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][3];
  textrotation_xf.m_xform[1][3] = ON_Xform::IdentityTransformation.m_xform[2][0];
  textrotation_xf.m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][1];
  textrotation_xf.m_xform[1][1] = ON_Xform::IdentityTransformation.m_xform[1][2];
  textrotation_xf.m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][3];
  textrotation_xf.m_xform[0][3] = ON_Xform::IdentityTransformation.m_xform[1][0];
  textrotation_xf.m_xform[1][0] = ON_Xform::IdentityTransformation.m_xform[1][1];
  textrotation_xf.m_xform[0][1] = ON_Xform::IdentityTransformation.m_xform[0][2];
  textrotation_xf.m_xform[0][2] = ON_Xform::IdentityTransformation.m_xform[0][3];
  world_to_leader_xf.m_xform[3][3] = ON_Xform::IdentityTransformation.m_xform[0][0];
  textrotation_xf.m_xform[0][0] = ON_Xform::IdentityTransformation.m_xform[0][1];
  world_to_leader_xf.m_xform[3][1] = ON_Xform::IdentityTransformation.m_xform[3][2];
  world_to_leader_xf.m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][3];
  world_to_leader_xf.m_xform[2][3] = ON_Xform::IdentityTransformation.m_xform[3][0];
  world_to_leader_xf.m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][1];
  world_to_leader_xf.m_xform[2][1] = ON_Xform::IdentityTransformation.m_xform[2][2];
  world_to_leader_xf.m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][3];
  world_to_leader_xf.m_xform[1][3] = ON_Xform::IdentityTransformation.m_xform[2][0];
  world_to_leader_xf.m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][1];
  world_to_leader_xf.m_xform[1][1] = ON_Xform::IdentityTransformation.m_xform[1][2];
  world_to_leader_xf.m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][3];
  world_to_leader_xf.m_xform[0][3] = ON_Xform::IdentityTransformation.m_xform[1][0];
  world_to_leader_xf.m_xform[1][0] = ON_Xform::IdentityTransformation.m_xform[1][1];
  world_to_leader_xf.m_xform[0][1] = ON_Xform::IdentityTransformation.m_xform[0][2];
  world_to_leader_xf.m_xform[0][2] = ON_Xform::IdentityTransformation.m_xform[0][3];
  leader_to_text_pt_xf.m_xform[3][3] = ON_Xform::IdentityTransformation.m_xform[0][0];
  world_to_leader_xf.m_xform[0][0] = ON_Xform::IdentityTransformation.m_xform[0][1];
  ON_Xform::Rotation((ON_Xform *)(leader_to_text_pt_xf.m_xform[3] + 3),&ON_Plane::World_xy,
                     (ON_Plane *)text_dir.y);
  leader_to_text_pt_xf.m_xform[3][1] = ON_Xform::IdentityTransformation.m_xform[3][2];
  leader_to_text_pt_xf.m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][3];
  leader_to_text_pt_xf.m_xform[2][3] = ON_Xform::IdentityTransformation.m_xform[3][0];
  leader_to_text_pt_xf.m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][1];
  leader_to_text_pt_xf.m_xform[2][1] = ON_Xform::IdentityTransformation.m_xform[2][2];
  leader_to_text_pt_xf.m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][3];
  leader_to_text_pt_xf.m_xform[1][3] = ON_Xform::IdentityTransformation.m_xform[2][0];
  leader_to_text_pt_xf.m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][1];
  leader_to_text_pt_xf.m_xform[1][1] = ON_Xform::IdentityTransformation.m_xform[1][2];
  leader_to_text_pt_xf.m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][3];
  leader_to_text_pt_xf.m_xform[0][3] = ON_Xform::IdentityTransformation.m_xform[1][0];
  leader_to_text_pt_xf.m_xform[1][0] = ON_Xform::IdentityTransformation.m_xform[1][1];
  leader_to_text_pt_xf.m_xform[0][1] = ON_Xform::IdentityTransformation.m_xform[0][2];
  leader_to_text_pt_xf.m_xform[0][2] = ON_Xform::IdentityTransformation.m_xform[0][3];
  auStack_5c8 = (undefined1  [8])ON_Xform::IdentityTransformation.m_xform[0][0];
  leader_to_text_pt_xf.m_xform[0][0] = ON_Xform::IdentityTransformation.m_xform[0][1];
  ON_2dVector::ON_2dVector(&local_658,(ON_2dPoint *)&landing_length);
  ON_Xform::TranslationTransformation(&local_648,&local_658);
  leader_to_text_pt_xf.m_xform[3][1] = local_648.m_xform[3][2];
  leader_to_text_pt_xf.m_xform[3][2] = local_648.m_xform[3][3];
  leader_to_text_pt_xf.m_xform[2][3] = local_648.m_xform[3][0];
  leader_to_text_pt_xf.m_xform[3][0] = local_648.m_xform[3][1];
  leader_to_text_pt_xf.m_xform[2][1] = local_648.m_xform[2][2];
  leader_to_text_pt_xf.m_xform[2][2] = local_648.m_xform[2][3];
  leader_to_text_pt_xf.m_xform[1][3] = local_648.m_xform[2][0];
  leader_to_text_pt_xf.m_xform[2][0] = local_648.m_xform[2][1];
  leader_to_text_pt_xf.m_xform[1][1] = local_648.m_xform[1][2];
  leader_to_text_pt_xf.m_xform[1][2] = local_648.m_xform[1][3];
  leader_to_text_pt_xf.m_xform[0][3] = local_648.m_xform[1][0];
  leader_to_text_pt_xf.m_xform[1][0] = local_648.m_xform[1][1];
  leader_to_text_pt_xf.m_xform[0][1] = local_648.m_xform[0][2];
  leader_to_text_pt_xf.m_xform[0][2] = local_648.m_xform[0][3];
  auStack_5c8 = (undefined1  [8])local_648.m_xform[0][0];
  leader_to_text_pt_xf.m_xform[0][0] = local_648.m_xform[0][1];
  axis.y = ON_3dVector::ZAxis.y;
  axis.x = ON_3dVector::ZAxis.x;
  axis.z = ON_3dVector::ZAxis.z;
  center.y = ON_3dPoint::Origin.y;
  center.x = ON_3dPoint::Origin.x;
  center.z = ON_3dPoint::Origin.z;
  ON_Xform::Rotation((ON_Xform *)(world_to_leader_xf.m_xform[3] + 3),text_dir.x,(double)local_330,
                     axis,center);
  TVar5 = ON_DimStyle::LeaderTextOrientation(dimstyle);
  if (TVar5 == InView) {
    text_point_3d.z = (double)ON_Annotation::Plane(&this->super_ON_Annotation);
    pOVar8 = ON_Annotation::Plane(&this->super_ON_Annotation);
    ON_Plane::PointAt((ON_3dPoint *)local_6b8,pOVar8,landing_length,text_pt2.x);
    ON_Xform::Rotation((ON_Xform *)(world_to_leader_xf.m_xform[3] + 3),(ON_3dPoint *)local_6b8,
                       (ON_3dVector *)((long)text_point_3d.z + 0x18),
                       (ON_3dVector *)((long)text_point_3d.z + 0x30),
                       (ON_3dVector *)((long)text_point_3d.z + 0x48),(ON_3dPoint *)local_6b8,
                       (ON_3dVector *)&view_y.z,(ON_3dVector *)&view_z.z,(ON_3dVector *)local_b0);
    ON_Xform::operator*(&local_738,(ON_Xform *)local_3c0,
                        (ON_Xform *)(textrotation_xf.m_xform[3] + 3));
    text_xform_out->m_xform[3][2] = local_738.m_xform[3][2];
    text_xform_out->m_xform[3][3] = local_738.m_xform[3][3];
    text_xform_out->m_xform[3][0] = local_738.m_xform[3][0];
    text_xform_out->m_xform[3][1] = local_738.m_xform[3][1];
    text_xform_out->m_xform[2][2] = local_738.m_xform[2][2];
    text_xform_out->m_xform[2][3] = local_738.m_xform[2][3];
    text_xform_out->m_xform[2][0] = local_738.m_xform[2][0];
    text_xform_out->m_xform[2][1] = local_738.m_xform[2][1];
    text_xform_out->m_xform[1][2] = local_738.m_xform[1][2];
    text_xform_out->m_xform[1][3] = local_738.m_xform[1][3];
    text_xform_out->m_xform[1][0] = local_738.m_xform[1][0];
    text_xform_out->m_xform[1][1] = local_738.m_xform[1][1];
    text_xform_out->m_xform[0][2] = local_738.m_xform[0][2];
    text_xform_out->m_xform[0][3] = local_738.m_xform[0][3];
    text_xform_out->m_xform[0][0] = local_738.m_xform[0][0];
    text_xform_out->m_xform[0][1] = local_738.m_xform[0][1];
    ON_Xform::operator*(&local_7b8,(ON_Xform *)auStack_5c8,text_xform_out);
    text_xform_out->m_xform[3][2] = local_7b8.m_xform[3][2];
    text_xform_out->m_xform[3][3] = local_7b8.m_xform[3][3];
    text_xform_out->m_xform[3][0] = local_7b8.m_xform[3][0];
    text_xform_out->m_xform[3][1] = local_7b8.m_xform[3][1];
    text_xform_out->m_xform[2][2] = local_7b8.m_xform[2][2];
    text_xform_out->m_xform[2][3] = local_7b8.m_xform[2][3];
    text_xform_out->m_xform[2][0] = local_7b8.m_xform[2][0];
    text_xform_out->m_xform[2][1] = local_7b8.m_xform[2][1];
    text_xform_out->m_xform[1][2] = local_7b8.m_xform[1][2];
    text_xform_out->m_xform[1][3] = local_7b8.m_xform[1][3];
    text_xform_out->m_xform[1][0] = local_7b8.m_xform[1][0];
    text_xform_out->m_xform[1][1] = local_7b8.m_xform[1][1];
    text_xform_out->m_xform[0][2] = local_7b8.m_xform[0][2];
    text_xform_out->m_xform[0][3] = local_7b8.m_xform[0][3];
    text_xform_out->m_xform[0][0] = local_7b8.m_xform[0][0];
    text_xform_out->m_xform[0][1] = local_7b8.m_xform[0][1];
    ON_Xform::operator*(&local_838,(ON_Xform *)(leader_to_text_pt_xf.m_xform[3] + 3),text_xform_out)
    ;
    text_xform_out->m_xform[3][2] = local_838.m_xform[3][2];
    text_xform_out->m_xform[3][3] = local_838.m_xform[3][3];
    text_xform_out->m_xform[3][0] = local_838.m_xform[3][0];
    text_xform_out->m_xform[3][1] = local_838.m_xform[3][1];
    text_xform_out->m_xform[2][2] = local_838.m_xform[2][2];
    text_xform_out->m_xform[2][3] = local_838.m_xform[2][3];
    text_xform_out->m_xform[2][0] = local_838.m_xform[2][0];
    text_xform_out->m_xform[2][1] = local_838.m_xform[2][1];
    text_xform_out->m_xform[1][2] = local_838.m_xform[1][2];
    text_xform_out->m_xform[1][3] = local_838.m_xform[1][3];
    text_xform_out->m_xform[1][0] = local_838.m_xform[1][0];
    text_xform_out->m_xform[1][1] = local_838.m_xform[1][1];
    text_xform_out->m_xform[0][2] = local_838.m_xform[0][2];
    text_xform_out->m_xform[0][3] = local_838.m_xform[0][3];
    text_xform_out->m_xform[0][0] = local_838.m_xform[0][0];
    text_xform_out->m_xform[0][1] = local_838.m_xform[0][1];
    ON_Xform::operator*(&local_8b8,(ON_Xform *)(world_to_leader_xf.m_xform[3] + 3),text_xform_out);
    memcpy(text_xform_out,&local_8b8,0x80);
    goto LAB_006a1962;
  }
  bVar4 = ON_DimStyle::DrawForward(dimstyle);
  if (bVar4) {
    bVar4 = ON_DimStyle::DrawForward(dimstyle);
    if (bVar4) {
      text_xdir.y = *(double *)((long)text_dir.y + 0x28);
      auStack_8d8 = *(undefined1 (*) [8])((long)text_dir.y + 0x18);
      text_xdir.x = *(double *)((long)text_dir.y + 0x20);
      text_ydir.y = *(double *)((long)text_dir.y + 0x40);
      auStack_8f8 = *(undefined1 (*) [8])((long)text_dir.y + 0x30);
      text_ydir.x = *(double *)((long)text_dir.y + 0x38);
      xfr.m_xform[3][3] = *(double *)((long)text_dir.y + 0x48);
      dVar11 = ON_3dVector::operator*((ON_3dVector *)(xfr.m_xform[3] + 3),(ON_3dVector *)local_b0);
      if (0.0 <= dVar11) {
        ON_3dVector::Transform
                  ((ON_3dVector *)auStack_8d8,(ON_Xform *)(world_to_leader_xf.m_xform[3] + 3));
        ON_3dVector::Transform
                  ((ON_3dVector *)auStack_8f8,(ON_Xform *)(world_to_leader_xf.m_xform[3] + 3));
        ON_3dVector::Transform
                  ((ON_3dVector *)(xfr.m_xform[3] + 3),
                   (ON_Xform *)(world_to_leader_xf.m_xform[3] + 3));
      }
      else {
        ON_Xform::Inverse((ON_Xform *)local_998,(ON_Xform *)(world_to_leader_xf.m_xform[3] + 3),
                          (double *)0x0);
        ON_3dVector::Transform((ON_3dVector *)auStack_8d8,(ON_Xform *)local_998);
        ON_3dVector::Transform((ON_3dVector *)auStack_8f8,(ON_Xform *)local_998);
        ON_3dVector::Transform((ON_3dVector *)(xfr.m_xform[3] + 3),(ON_Xform *)local_998);
      }
      if (model_xform != (ON_Xform *)0x0) {
        ON_3dVector::Transform((ON_3dVector *)auStack_8d8,model_xform);
        ON_3dVector::Transform((ON_3dVector *)auStack_8f8,model_xform);
        ON_3dVector::Transform((ON_3dVector *)(xfr.m_xform[3] + 3),model_xform);
      }
      fliptol._7_1_ = 0;
      fliptol._6_1_ = 0;
      if (vp == (ON_Viewport *)0x0) {
LAB_006a15b9:
        local_fa8 = cos(1.53588974175501);
      }
      else {
        vVar7 = ON_Viewport::Projection(vp);
        if (vVar7 != perspective_view) goto LAB_006a15b9;
        local_fa8 = 0.0;
      }
      mxf.m_xform[3][3] = local_fa8;
      ON_Annotation::CalcTextFlip
                ((ON_3dVector *)auStack_8d8,(ON_3dVector *)auStack_8f8,
                 (ON_3dVector *)(xfr.m_xform[3] + 3),(ON_3dVector *)&view_y.z,
                 (ON_3dVector *)&view_z.z,(ON_3dVector *)local_b0,model_xform,local_fa8,
                 (bool *)((long)&fliptol + 7),(bool *)((long)&fliptol + 6));
      ON_Xform::ON_Xform((ON_Xform *)local_a28);
      if ((fliptol._7_1_ & 1) != 0) {
        local_a38 = ON_3dPoint::Origin.z;
        local_a48 = ON_3dPoint::Origin.x;
        dStack_a40 = ON_3dPoint::Origin.y;
        local_a58 = ON_3dVector::XAxis.z;
        local_a68 = ON_3dVector::XAxis.x;
        dStack_a60 = ON_3dVector::XAxis.y;
        point_on_mirror_plane.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane.y = ON_3dVector::XAxis.y;
        normal_to_mirror_plane.x = ON_3dVector::XAxis.x;
        normal_to_mirror_plane.z = ON_3dVector::XAxis.z;
        ON_Xform::Mirror((ON_Xform *)local_a28,point_on_mirror_plane,normal_to_mirror_plane);
        ON_Xform::operator*(&local_ae8,(ON_Xform *)local_3c0,(ON_Xform *)local_a28);
        memcpy(local_3c0,&local_ae8,0x80);
      }
      if ((fliptol._6_1_ & 1) != 0) {
        local_af8 = ON_3dPoint::Origin.z;
        local_b08 = ON_3dPoint::Origin.x;
        dStack_b00 = ON_3dPoint::Origin.y;
        local_b18 = ON_3dVector::YAxis.z;
        local_b28 = ON_3dVector::YAxis.x;
        dStack_b20 = ON_3dVector::YAxis.y;
        point_on_mirror_plane_00.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane_00.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane_00.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane_00.y = ON_3dVector::YAxis.y;
        normal_to_mirror_plane_00.x = ON_3dVector::YAxis.x;
        normal_to_mirror_plane_00.z = ON_3dVector::YAxis.z;
        ON_Xform::Mirror((ON_Xform *)local_a28,point_on_mirror_plane_00,normal_to_mirror_plane_00);
        ON_Xform::operator*(&local_ba8,(ON_Xform *)local_3c0,(ON_Xform *)local_a28);
        memcpy(local_3c0,&local_ba8,0x80);
      }
    }
  }
  ON_Xform::operator*(&local_c28,(ON_Xform *)local_3c0,(ON_Xform *)(textrotation_xf.m_xform[3] + 3))
  ;
  text_xform_out->m_xform[3][2] = local_c28.m_xform[3][2];
  text_xform_out->m_xform[3][3] = local_c28.m_xform[3][3];
  text_xform_out->m_xform[3][0] = local_c28.m_xform[3][0];
  text_xform_out->m_xform[3][1] = local_c28.m_xform[3][1];
  text_xform_out->m_xform[2][2] = local_c28.m_xform[2][2];
  text_xform_out->m_xform[2][3] = local_c28.m_xform[2][3];
  text_xform_out->m_xform[2][0] = local_c28.m_xform[2][0];
  text_xform_out->m_xform[2][1] = local_c28.m_xform[2][1];
  text_xform_out->m_xform[1][2] = local_c28.m_xform[1][2];
  text_xform_out->m_xform[1][3] = local_c28.m_xform[1][3];
  text_xform_out->m_xform[1][0] = local_c28.m_xform[1][0];
  text_xform_out->m_xform[1][1] = local_c28.m_xform[1][1];
  text_xform_out->m_xform[0][2] = local_c28.m_xform[0][2];
  text_xform_out->m_xform[0][3] = local_c28.m_xform[0][3];
  text_xform_out->m_xform[0][0] = local_c28.m_xform[0][0];
  text_xform_out->m_xform[0][1] = local_c28.m_xform[0][1];
  ON_Xform::operator*(&local_ca8,(ON_Xform *)(world_to_leader_xf.m_xform[3] + 3),text_xform_out);
  text_xform_out->m_xform[3][2] = local_ca8.m_xform[3][2];
  text_xform_out->m_xform[3][3] = local_ca8.m_xform[3][3];
  text_xform_out->m_xform[3][0] = local_ca8.m_xform[3][0];
  text_xform_out->m_xform[3][1] = local_ca8.m_xform[3][1];
  text_xform_out->m_xform[2][2] = local_ca8.m_xform[2][2];
  text_xform_out->m_xform[2][3] = local_ca8.m_xform[2][3];
  text_xform_out->m_xform[2][0] = local_ca8.m_xform[2][0];
  text_xform_out->m_xform[2][1] = local_ca8.m_xform[2][1];
  text_xform_out->m_xform[1][2] = local_ca8.m_xform[1][2];
  text_xform_out->m_xform[1][3] = local_ca8.m_xform[1][3];
  text_xform_out->m_xform[1][0] = local_ca8.m_xform[1][0];
  text_xform_out->m_xform[1][1] = local_ca8.m_xform[1][1];
  text_xform_out->m_xform[0][2] = local_ca8.m_xform[0][2];
  text_xform_out->m_xform[0][3] = local_ca8.m_xform[0][3];
  text_xform_out->m_xform[0][0] = local_ca8.m_xform[0][0];
  text_xform_out->m_xform[0][1] = local_ca8.m_xform[0][1];
  ON_Xform::operator*(&local_d28,(ON_Xform *)auStack_5c8,text_xform_out);
  text_xform_out->m_xform[3][2] = local_d28.m_xform[3][2];
  text_xform_out->m_xform[3][3] = local_d28.m_xform[3][3];
  text_xform_out->m_xform[3][0] = local_d28.m_xform[3][0];
  text_xform_out->m_xform[3][1] = local_d28.m_xform[3][1];
  text_xform_out->m_xform[2][2] = local_d28.m_xform[2][2];
  text_xform_out->m_xform[2][3] = local_d28.m_xform[2][3];
  text_xform_out->m_xform[2][0] = local_d28.m_xform[2][0];
  text_xform_out->m_xform[2][1] = local_d28.m_xform[2][1];
  text_xform_out->m_xform[1][2] = local_d28.m_xform[1][2];
  text_xform_out->m_xform[1][3] = local_d28.m_xform[1][3];
  text_xform_out->m_xform[1][0] = local_d28.m_xform[1][0];
  text_xform_out->m_xform[1][1] = local_d28.m_xform[1][1];
  text_xform_out->m_xform[0][2] = local_d28.m_xform[0][2];
  text_xform_out->m_xform[0][3] = local_d28.m_xform[0][3];
  text_xform_out->m_xform[0][0] = local_d28.m_xform[0][0];
  text_xform_out->m_xform[0][1] = local_d28.m_xform[0][1];
  ON_Xform::operator*(&local_da8,(ON_Xform *)(leader_to_text_pt_xf.m_xform[3] + 3),text_xform_out);
  memcpy(text_xform_out,&local_da8,0x80);
LAB_006a1962:
  text_xdir.z._4_4_ = 1;
  ON_Plane::~ON_Plane((ON_Plane *)auStack_138);
  return true;
}

Assistant:

bool ON_Leader::GetTextXform(
  const ON_Xform* model_xform,
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Xform& text_xform_out
) const
{
  if (nullptr == dimstyle)
    return false;

  const ON_TextContent* text = Text();
  if (nullptr == text)
    return true;

  const ON_TextMask::MaskFrame maskframe = dimstyle->MaskFrameType();
  const ON_DimStyle::ContentAngleStyle textangle_style = dimstyle->LeaderContentAngleStyle();

  ON_2dVector tail_dir = TailDirection(dimstyle);
  ON_3dVector view_x = nullptr == vp ? ON_3dVector::XAxis : vp->CameraX();
  ON_3dVector view_y = nullptr == vp ? ON_3dVector::YAxis : vp->CameraY();
  ON_3dVector view_z = ON_CrossProduct(view_x, view_y);
  ON_Plane objectplane = Plane();
  ON::TextHorizontalAlignment halign = dimstyle->LeaderTextHorizontalAlignment();
  ON::TextVerticalAlignment valign = dimstyle->LeaderTextVerticalAlignment();
  if (ON::TextHorizontalAlignment::Auto == halign)
  {
    double xdotx = objectplane.xaxis * view_x;
    if (tail_dir.x < -0.00001)
      xdotx = -xdotx;
    if (xdotx > -0.00001)
      halign = ON::TextHorizontalAlignment::Left;
    else
      halign = ON::TextHorizontalAlignment::Right;
  }
  ON::TextHorizontalAlignment last_halign = text->RuntimeHorizontalAlignment();
  text->SetRuntimeHorizontalAlignment(halign);

  if (last_halign != halign)
  {
    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }
  if (DimStyleTextPositionPropertiesHash() != dimstyle->TextPositionPropertiesHash())
  {
    ON_wString rtfstr = text->RtfText();
    const_cast<ON_TextContent*>(text)->Create(
      rtfstr, ON::AnnotationType::Leader, dimstyle,
      text->TextIsWrapped(), text->FormattingRectangleWidth(), text->TextRotationRadians());

    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }

  // Find center of scaled text
  double textblock_width = 0.0;
  double textblock_height = 0.0;
  double line_height = 1.0;

  ON_2dPoint text_corners[4];
  ON_2dPoint text_center;
  ON_2dPoint text_pt(0.0, 0.0);
  if (text->Get2dCorners(text_corners)) // Gets unscaled 3d size
  {
    text_center = (text_corners[0] + text_corners[2]) / 2.0;
    textblock_width = (text_corners[1].x - text_corners[0].x);
    textblock_height = (text_corners[3].y - text_corners[0].y);
    line_height = dimstyle->TextHeight();

    ON_2dVector text_shift;
    text_shift.x = 0.0;
    text_shift.y = 0.0;

    if (ON_TextMask::MaskFrame::CapsuleFrame != maskframe)
    {
      // LeaderAttachStyle - Vertical alignment of text with leader text point
      ON::TextVerticalAlignment attach = dimstyle->LeaderTextVerticalAlignment();
      switch (attach)
      {
      case ON::TextVerticalAlignment::Top:
        text_shift.y = -textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfTop:
        text_shift.y = -(textblock_height / 2.0) + (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::BottomOfTop:
        text_shift.y = -(textblock_height / 2.0) + line_height;
        break;
      case ON::TextVerticalAlignment::Middle:
        text_shift.y = 0.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfBottom:
        text_shift.y = (textblock_height / 2.0) - (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::Bottom:
        text_shift.y = textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::BottomOfBoundingBox:
        text_shift.y = (textblock_height / 2.0) + (dimstyle->TextGap());   /*(line_height / 10.0);*/
        break;
      }
    }

    // 2d Point at center of text but without vertical alignment shift
    ON_2dPoint text_pt2(0.0, 0.0);
    if (0 < m_points.Count())
      text_pt2 = m_points[m_points.Count() - 1];

    double landing_length = 0.0;
    if (dimstyle->LeaderHasLanding())
      landing_length = dimstyle->LeaderLandingLength();
    double text_gap = dimstyle->TextGap();

    if (maskframe != ON_TextMask::MaskFrame::NoFrame)
    {
      text_gap += dimstyle->TextMask().MaskBorder(); // RH-71452
    }

    if (maskframe == ON_TextMask::MaskFrame::CapsuleFrame)
    {
      double half_height = dimscale * (textblock_height * 0.5 + text_gap);
      double radius = ON_2dVector(half_height, half_height).Length();
      if (landing_length > 0.0)
      {
        tail_dir = tail_dir.x < 0 ? ON_2dVector(-1, 0) : ON_2dVector(1, 0);
        text_pt2 = text_pt2 + (tail_dir * landing_length);
      }

      if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style && landing_length == 0.0)
      {
        text_pt2 = text_pt2 + (tail_dir * (textblock_width * 0.5 + text_gap - radius * 0.5));
      }
      else if (fabs(tail_dir.x) > 0.1 && textblock_width > textblock_height)
      {
        if (tail_dir.x > 0)
        {
          text_pt2.x += (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
        else
        {
          text_pt2.x -= (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
      }
      text_pt2 = text_pt2 + (tail_dir * radius);
    }
    else
    {
      double x_offset = dimscale * (landing_length + text_gap + textblock_width / 2.0);

      text_pt2 = text_pt2 + (tail_dir * x_offset);
    }

    // Move from Origin to leader plane
    const ON_Plane& leaderplane = Plane();

    ON_2dVector text_dir(1.0, 0.0);     // Horizontal to cplane - ON_DimStyle::ContentAngleStyle::Horizontal
    if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style)
    {
      text_dir = tail_dir;
      if (text_dir.x < 0.0)
        text_dir = -text_dir;
    }
    else if (ON_DimStyle::ContentAngleStyle::Rotated == textangle_style)
    {
      text_dir = tail_dir;  // Already has rotation included
    }
    if (!text_dir.Unitize())
      text_dir.Set(1.0, 0.0);

    ON_Xform textscale_xf(ON_Xform::DiagonalTransformation(dimscale));
    ON_Xform textcenter_xf(ON_Xform::IdentityTransformation);        // Centers text block at origin
    ON_Xform textrotation_xf(ON_Xform::IdentityTransformation);      // Text rotation around origin

    ON_Xform world_to_leader_xf(ON_Xform::IdentityTransformation);   // WCS plane to leader plane rotation
    world_to_leader_xf.Rotation(ON_Plane::World_xy, leaderplane);    // Rotate text from starting text plane (wcs) to leader plane

    ON_Xform leader_to_text_pt_xf(ON_Xform::IdentityTransformation); // Leader plane to text point translation
    leader_to_text_pt_xf = ON_Xform::TranslationTransformation(text_pt2);

    textrotation_xf.Rotation(text_dir.y, text_dir.x, ON_3dVector::ZAxis, ON_3dPoint::Origin);

    textcenter_xf.m_xform[0][3] = -text_center.x;
    textcenter_xf.m_xform[1][3] = -text_center.y + text_shift.y;

    if (ON::TextOrientation::InView == dimstyle->LeaderTextOrientation())
    {
      const ON_Plane& ldrplane = Plane();
      ON_3dPoint text_point_3d = Plane().PointAt(text_pt2.x, text_pt2.y);
      textrotation_xf.Rotation(text_point_3d, ldrplane.xaxis, ldrplane.yaxis, ldrplane.zaxis, text_point_3d, view_x, view_y, view_z);
      text_xform_out = textscale_xf * textcenter_xf;
      text_xform_out = leader_to_text_pt_xf * text_xform_out;
      text_xform_out = world_to_leader_xf * text_xform_out;
      text_xform_out = textrotation_xf * text_xform_out;
      return true;
    }
    else if (dimstyle->DrawForward())
    {
      if (dimstyle->DrawForward())
      {
        // Check if the text is right-reading by comparing
        // text plane x and y, rotated by text rotation angle,
        // to view right and up

        ON_3dVector text_xdir = leaderplane.xaxis;
        ON_3dVector text_ydir = leaderplane.yaxis;
        ON_3dVector text_zdir = leaderplane.zaxis;
        if (text_zdir * view_z < 0.0)
        {
          ON_Xform xfr = textrotation_xf.Inverse();
          text_xdir.Transform(xfr);
          text_ydir.Transform(xfr);
          text_zdir.Transform(xfr);
        }
        else
        {
          text_xdir.Transform(textrotation_xf);
          text_ydir.Transform(textrotation_xf);
          text_zdir.Transform(textrotation_xf);
        }

        if (nullptr != model_xform)
        {
          text_xdir.Transform(*model_xform);
          text_ydir.Transform(*model_xform);
          text_zdir.Transform(*model_xform);
        }

        bool flip_x = false;
        bool flip_y = false;
        const double fliptol = (nullptr != vp && vp->Projection() == ON::view_projection::perspective_view) ? 0.0 : cos(88.0 * ON_DEGREES_TO_RADIANS);
        CalcTextFlip(
          text_xdir, text_ydir, text_zdir,
          view_x, view_y, view_z,
          model_xform,
          fliptol,
          flip_x,
          flip_y);

        ON_Xform mxf;
        if (flip_x)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::XAxis);
          textscale_xf = textscale_xf * mxf;
        }
        if (flip_y)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::YAxis);
          textscale_xf = textscale_xf * mxf;
        }
      }
    }

    text_xform_out = textscale_xf * textcenter_xf;
    text_xform_out = textrotation_xf * text_xform_out;
    text_xform_out = leader_to_text_pt_xf * text_xform_out;
    text_xform_out = world_to_leader_xf * text_xform_out;
  }
  return true;
}